

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawEllipseLines(int centerX,int centerY,float radiusH,float radiusV,Color color)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  rlBegin(1);
  uVar1 = 0;
  while (uVar1 < 0x168) {
    rlColor4ub(color.r,color.g,color.b,color.a);
    fVar3 = (float)(int)(uVar1 + 10) * 0.017453292;
    fVar2 = cosf(fVar3);
    fVar3 = sinf(fVar3);
    rlVertex2f(fVar2 * radiusH + (float)centerX,fVar3 * radiusV + (float)centerY);
    fVar2 = cosf((float)(int)uVar1 * 0.017453292);
    fVar3 = sinf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar2 * radiusH + (float)centerX,fVar3 * radiusV + (float)centerY);
    uVar1 = uVar1 + 10;
  }
  rlEnd();
  return;
}

Assistant:

void DrawEllipseLines(int centerX, int centerY, float radiusH, float radiusV, Color color)
{
    rlBegin(RL_LINES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(centerX + cosf(DEG2RAD*(i + 10))*radiusH, centerY + sinf(DEG2RAD*(i + 10))*radiusV);
            rlVertex2f(centerX + cosf(DEG2RAD*i)*radiusH, centerY + sinf(DEG2RAD*i)*radiusV);
        }
    rlEnd();
}